

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_mainwindow.cpp
# Opt level: O0

void MainWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  MainWindow *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if ((_c == InvokeMetaMethod) && (_id == 0)) {
    handleGameOver((MainWindow *)_o,*_a[1]);
  }
  return;
}

Assistant:

void MainWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<MainWindow *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->handleGameOver((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
}